

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  double *pdVar5;
  ulong uVar6;
  value_type vVar7;
  
  uVar4 = FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
          ::size(&fadexpr->fadexpr_);
  uVar2 = (this->dx_).num_elts;
  if (uVar4 != uVar2) {
    if (uVar4 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar4;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar4) {
        uVar6 = (long)(int)uVar4 << 3;
      }
      pdVar5 = (double *)operator_new__(uVar6);
      (this->dx_).ptr_to_data = pdVar5;
    }
  }
  if (uVar4 != 0) {
    pdVar5 = (this->dx_).ptr_to_data;
    bVar3 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
            ::hasFastAccess(&((fadexpr->fadexpr_).right_)->fadexpr_);
    if (bVar3) {
      if (0 < (int)uVar4) {
        uVar6 = 0;
        do {
          vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                  ::fastAccessDx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar6);
          pdVar5[uVar6] = vVar7 * (fadexpr->fadexpr_).left_.constant_;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
    }
    else if (0 < (int)uVar4) {
      uVar6 = 0;
      do {
        vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                ::dx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar6);
        pdVar5[uVar6] = vVar7 * (fadexpr->fadexpr_).left_.constant_;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  dVar1 = (fadexpr->fadexpr_).left_.constant_;
  vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
          ::val(&((fadexpr->fadexpr_).right_)->fadexpr_);
  this->val_ = vVar7 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}